

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O2

void __thiscall setup::language_entry::load(language_entry *this,istream *is,info *i)

{
  bool bVar1;
  uint uVar2;
  ushort *puVar3;
  uint uVar4;
  ulong uVar5;
  codepage_id codepage;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  
  if (0x3ffffff < (i->version).value) {
    util::binary_string::load(is,&this->name);
  }
  util::binary_string::load(is,&this->language_name);
  if ((i->version).value == 0x5050701) {
    util::binary_string::skip(is);
  }
  util::binary_string::load(is,&this->dialog_font);
  util::binary_string::load(is,&this->title_font);
  util::binary_string::load(is,&this->welcome_font);
  util::binary_string::load(is,&this->copyright_font);
  if (((i->version).value < 0x4000000) ||
     (util::binary_string::load(is,&this->data), (i->version).value < 0x4000100)) {
    (this->license_text)._M_string_length = 0;
    *(this->license_text)._M_dataplus._M_p = '\0';
    (this->info_before)._M_string_length = 0;
    *(this->info_before)._M_dataplus._M_p = '\0';
    (this->info_after)._M_string_length = 0;
    *(this->info_after)._M_dataplus._M_p = '\0';
  }
  else {
    util::binary_string::load(is,&this->license_text);
    util::binary_string::load(is,&this->info_before);
    util::binary_string::load(is,&this->info_after);
  }
  uVar2 = util::load<int,util::little_endian>(is);
  this->language_id = uVar2;
  if ((i->version).value < 0x4020200) {
    puVar3 = (ushort *)(anonymous_namespace)::languages;
    uVar5 = 0x39;
    while (0 < (long)uVar5) {
      uVar6 = uVar5 >> 1;
      uVar7 = ~uVar6 + uVar5;
      uVar5 = uVar6;
      if (puVar3[uVar6 * 2] < uVar2) {
        puVar3 = puVar3 + uVar6 * 2 + 2;
        uVar5 = uVar7;
      }
    }
    uVar4 = 0x4e4;
    if ((puVar3 != (ushort *)&DAT_0014e4b4) && (uVar2 == *puVar3)) {
      uVar4 = (uint)puVar3[1];
    }
  }
  else {
    bVar1 = version::is_unicode(&i->version);
    if (bVar1) {
      if ((i->version).value < 0x5030000) {
        util::load<int,util::little_endian>(is);
      }
      this->codepage = 0x4b0;
      uVar4 = 0x4b0;
      goto LAB_00139ff2;
    }
    uVar2 = util::load<int,util::little_endian>(is);
    uVar4 = 0x4e4;
    if (uVar2 != 0) {
      uVar4 = uVar2;
    }
  }
  this->codepage = uVar4;
LAB_00139ff2:
  codepage = 0x4b0;
  if ((i->version).value < 0x4020200) {
    codepage = uVar4;
  }
  sVar8 = 0;
  util::to_utf8(&this->language_name,codepage,(bitset<256UL> *)0x0);
  uVar2 = util::load<int,util::little_endian>(is);
  this->dialog_font_size = (ulong)uVar2;
  if ((i->version).value < 0x4010000) {
    uVar2 = util::load<int,util::little_endian>(is);
    sVar8 = (size_t)uVar2;
  }
  this->dialog_font_standard_height = sVar8;
  uVar2 = util::load<int,util::little_endian>(is);
  this->title_font_size = (ulong)uVar2;
  uVar2 = util::load<int,util::little_endian>(is);
  this->welcome_font_size = (ulong)uVar2;
  uVar2 = util::load<int,util::little_endian>(is);
  this->copyright_font_size = (ulong)uVar2;
  uVar2 = (i->version).value;
  if (uVar2 == 0x5050701) {
    util::load<int,util::little_endian>(is);
    uVar2 = (i->version).value;
  }
  if (uVar2 < 0x5020300) {
    bVar1 = false;
  }
  else {
    bVar1 = util::load_bool(is);
  }
  this->right_to_left = bVar1;
  return;
}

Assistant:

void language_entry::load(std::istream & is, const info & i) {
	
	if(i.version >= INNO_VERSION(4, 0, 0)) {
		is >> util::binary_string(name);
	}
	
	is >> util::binary_string(language_name);
	
	if(i.version == INNO_VERSION_EXT(5, 5, 7, 1)) {
		util::binary_string::skip(is);
	}
	
	is >> util::binary_string(dialog_font);
	is >> util::binary_string(title_font);
	is >> util::binary_string(welcome_font);
	is >> util::binary_string(copyright_font);
	
	if(i.version >= INNO_VERSION(4, 0, 0)) {
		is >> util::binary_string(data);
	}
	
	if(i.version >= INNO_VERSION(4, 0, 1)) {
		is >> util::binary_string(license_text);
		is >> util::binary_string(info_before);
		is >> util::binary_string(info_after);
	} else {
		license_text.clear(), info_before.clear(), info_after.clear();
	}
	
	language_id = util::load<boost::uint32_t>(is);
	
	if(i.version < INNO_VERSION(4, 2, 2)) {
		codepage = default_codepage_for_language(language_id);
	} else if(!i.version.is_unicode()) {
		codepage = util::load<boost::uint32_t>(is);
		if(!codepage) {
			codepage = util::cp_windows1252;
		}
	} else {
		if(i.version < INNO_VERSION(5, 3, 0)) {
			(void)util::load<boost::uint32_t>(is);
		}
		codepage = util::cp_utf16le;
	}
	
	if(i.version >= INNO_VERSION(4, 2, 2)) {
		util::to_utf8(language_name, util::cp_utf16le);
	} else {
		util::to_utf8(language_name, codepage);
	}
	
	dialog_font_size = util::load<boost::uint32_t>(is);
	
	if(i.version < INNO_VERSION(4, 1, 0)) {
		dialog_font_standard_height = util::load<boost::uint32_t>(is);
	} else {
		dialog_font_standard_height = 0;
	}
	
	title_font_size = util::load<boost::uint32_t>(is);
	welcome_font_size = util::load<boost::uint32_t>(is);
	copyright_font_size = util::load<boost::uint32_t>(is);
	
	if(i.version == INNO_VERSION_EXT(5, 5, 7, 1)) {
		util::load<boost::uint32_t>(is); // always 8 or 9?
	}
	
	if(i.version >= INNO_VERSION(5, 2, 3)) {
		right_to_left = util::load_bool(is);
	} else {
		right_to_left = false;
	}
	
}